

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfloat.c
# Opt level: O3

int mpt_cfloat(float *val,char *src,float *range)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  float fVar4;
  char *end;
  char *local_30;
  
  if (src == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    if (*src != '\0') {
      fVar4 = strtof(src,&local_30);
      if (local_30 == src) {
        do {
          cVar1 = *src;
          if ((long)cVar1 == 0) {
            return 0;
          }
          ppuVar3 = __ctype_b_loc();
          src = src + 1;
        } while ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0);
        iVar2 = -3;
      }
      else if ((range == (float *)0x0) ||
              ((iVar2 = -2, *range <= fVar4 && (fVar4 < range[1] || fVar4 == range[1])))) {
        if (val != (float *)0x0) {
          *val = fVar4;
        }
        iVar2 = (int)local_30 - (int)src;
      }
    }
  }
  return iVar2;
}

Assistant:

extern int mpt_cfloat(float *val, const char *src, const float range[2])
{
#if _XOPEN_SOURCE >= 600 || _ISOC99_SOURCE || _POSIX_C_SOURCE >= 200112L
	float tmp;
	char *end;
	
	if (!src) {
		return MPT_ERROR(BadArgument);
	}
	if (!*src) {
		return 0;
	}
	tmp = strtof(src, &end);
	
	if (end == src) {
		/* accept space as empty string */
		while (*src) {
			if (!isspace(*src++)) {
				return MPT_ERROR(BadType);
			}
		}
		return 0;
	}
	if (range && (range[0] > tmp || tmp > range[1])) {
		return MPT_ERROR(BadValue);
	}
	if (val) {
		*val = tmp;
	}
	return end - src;
#else
	double tmp, rf[2] = { 0, 0 };
	int ret;
	
	if (range) {
		rf[0] = range[0];
		rf[1] = range[1];
	}
	
	if ((ret = mpt_cdouble(&tmp, src, range ? rf : 0)) > 0 && val) {
		*val = tmp;
	}
	return ret;
#endif
}